

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

bool CheckStrifeItem(player_t *player,PClassActor *itemtype,int amount)

{
  AInventory *pAVar1;
  bool bVar2;
  
  bVar2 = true;
  if (amount != 0 && itemtype != (PClassActor *)0x0) {
    pAVar1 = AActor::FindInventory((player->ConversationPC).field_0.p,itemtype,false);
    if (pAVar1 == (AInventory *)0x0) {
      bVar2 = false;
    }
    else if (-1 < amount) {
      bVar2 = amount <= pAVar1->Amount;
    }
  }
  return bVar2;
}

Assistant:

static bool CheckStrifeItem (player_t *player, PClassActor *itemtype, int amount=-1)
{
	AInventory *item;

	if (itemtype == NULL || amount == 0)
		return true;

	item = player->ConversationPC->FindInventory (itemtype);
	if (item == NULL)
		return false;

	return amount < 0 || item->Amount >= amount;
}